

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O0

IceTCommRequest create_request(void)

{
  void *pvVar1;
  IceTCommRequest request;
  
  request = (IceTCommRequest)malloc(0x10);
  if (request == (IceTCommRequest)0x0) {
    icetRaiseDiagnostic("Could not allocate memory for IceTCommRequest",0xfffffffc,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,0x83);
    request = (IceTCommRequest)0x0;
  }
  else {
    request->magic_number = 0xd7168b00;
    pvVar1 = malloc(8);
    request->internals = pvVar1;
    if (request->internals == (IceTVoid *)0x0) {
      free(request);
      icetRaiseDiagnostic("Could not allocate memory for IceTCommRequest",0xfffffffc,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                          ,0x8c);
      request = (IceTCommRequest)0x0;
    }
    else {
      setMPIRequest(request,(MPI_Request)&ompi_request_null);
    }
  }
  return request;
}

Assistant:

static IceTCommRequest create_request(void)
{
    IceTCommRequest request;

    request = (IceTCommRequest)malloc(sizeof(struct IceTCommRequestStruct));
    if (request == NULL) {
        icetRaiseError("Could not allocate memory for IceTCommRequest",
                       ICET_OUT_OF_MEMORY);
        return NULL;
    }

    request->magic_number = ICET_MPI_REQUEST_MAGIC_NUMBER;
    request->internals=malloc(sizeof(struct IceTMPICommRequestInternalsStruct));
    if (request->internals == NULL) {
        free(request);
        icetRaiseError("Could not allocate memory for IceTCommRequest",
                       ICET_OUT_OF_MEMORY);
        return NULL;
    }

    setMPIRequest(request, MPI_REQUEST_NULL);

    return request;
}